

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O3

uint32 __thiscall crnlib::random::fast_urand32(random *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = (this->m_well512).m_index;
  uVar1 = (this->m_well512).m_state[uVar2];
  uVar3 = (this->m_well512).m_state[uVar2 + 0xd & 0xf];
  uVar4 = uVar1 << 0x10 ^ uVar1 ^ uVar3;
  uVar1 = (this->m_well512).m_state[uVar2 + 9 & 0xf];
  uVar1 = uVar1 >> 0xb ^ uVar1;
  uVar5 = uVar3 << 0xf ^ uVar4 ^ uVar1;
  (this->m_well512).m_state[uVar2] = uVar5;
  uVar3 = (this->m_well512).m_index - 1 & 0xf;
  (this->m_well512).m_index = uVar3;
  uVar2 = (this->m_well512).m_state[uVar3];
  uVar2 = uVar1 ^ uVar2 ^ uVar1 << 0x1c ^ uVar4 << 0x12 ^ uVar2 * 4 ^ (uVar5 & 0x6d22169) << 5;
  (this->m_well512).m_state[uVar3] = uVar2;
  return uVar2;
}

Assistant:

inline uint32 well512::next()
    {
        uint32 a, b, c, d;
        a = m_state[m_index];
        c = m_state[(m_index + 13) & 15];
        b = a ^ c ^ (a << 16) ^ (c << 15);
        c = m_state[(m_index + 9) & 15];
        c ^= (c >> 11);
        a = m_state[m_index] = b ^ c;
        d = a ^ ((a << 5) & 0xDA442D20UL);
        m_index = (m_index + 15) & 15;
        a = m_state[m_index];
        m_state[m_index] = a ^ b ^ d ^ (a << 2) ^ (b << 18) ^ (c << 28);
        return m_state[m_index];
    }